

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O3

RawSchema * __thiscall capnp::SchemaLoader::Impl::loadNative(Impl *this,RawSchema *nativeSchema)

{
  Initializer *pIVar1;
  undefined8 uVar2;
  Initializer *pIVar3;
  uint64_t uVar4;
  word *pwVar5;
  uint16_t *puVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  undefined4 uVar10;
  bool bVar11;
  RawSchema *schema;
  RawSchema **ppRVar12;
  RawSchema *pRVar13;
  ulong uVar14;
  bool bVar15;
  ArrayPtr<const_capnp::_::RawBrandedSchema::Dependency> AVar16;
  Fault f;
  RawSchema *nativeSchema_local;
  DebugComparison<const_capnp::_::RawSchema_*&,_const_capnp::_::RawSchema_*&> _kjCondition;
  Reader existing;
  CompatibilityChecker checker;
  ArrayPtr<const_char> local_80;
  Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> local_70;
  ArrayPtr<const_char> local_58;
  WirePointer *local_48;
  int local_40;
  
  nativeSchema_local = nativeSchema;
  kj::
  Table<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Entry,kj::HashIndex<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Callbacks>>
  ::find<0ul,unsigned_long_const&>
            ((Table<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Entry,kj::HashIndex<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Callbacks>>
              *)&checker,(unsigned_long *)&this->schemas);
  if (checker.loader == (Impl *)0x0) {
    bVar15 = false;
    schema = (RawSchema *)kj::Arena::allocateBytes(&this->arena,0x78,8,false);
    schema->lazyInitializer = (Initializer *)0x0;
    (schema->defaultBrand).generic = (RawSchema *)0x0;
    schema->id = 0;
    schema->encodedNode = (word *)0x0;
    *(undefined8 *)&schema->encodedSize = 0;
    schema->dependencies = (RawSchema **)0x0;
    schema->membersByName = (uint16_t *)0x0;
    schema->dependencyCount = 0;
    schema->memberCount = 0;
    schema->membersByDiscriminant = (uint16_t *)0x0;
    schema->canCastTo = (RawSchema *)0x0;
    (schema->defaultBrand).scopes = (Scope *)0x0;
    (schema->defaultBrand).dependencies = (Dependency *)0x0;
    *(undefined8 *)&schema->mayContainCapabilities = 0;
    schema->mayContainCapabilities = true;
    (schema->defaultBrand).scopeCount = 0;
    (schema->defaultBrand).dependencyCount = 0;
    (schema->defaultBrand).lazyInitializer = (Initializer *)0x0;
    (schema->defaultBrand).generic = schema;
    checker.loader = (Impl *)nativeSchema->id;
    checker.nodeName.super_StringPtr.content.ptr = (char *)schema;
    kj::
    Table<kj::HashMap<unsigned_long,_capnp::_::RawSchema_*>::Entry,_kj::HashIndex<kj::HashMap<unsigned_long,_capnp::_::RawSchema_*>::Callbacks>_>
    ::insert(&(this->schemas).table,(Entry *)&checker);
  }
  else {
    schema = (RawSchema *)((checker.loader)->arena).chunkList;
    ppRVar12 = &schema->canCastTo;
    if (schema->canCastTo != (RawSchema *)0x0) {
      _kjCondition.right = &nativeSchema_local;
      _kjCondition.op.content.ptr = " == ";
      _kjCondition.op.content.size_ = 5;
      _kjCondition.result = schema->canCastTo == nativeSchema;
      if (_kjCondition.result) {
        return schema;
      }
      existing._reader.data = nativeSchema->encodedNode;
      existing._reader.segment = (SegmentReader *)0x0;
      existing._reader.capTable = (CapTableReader *)0x0;
      existing._reader.pointers._0_4_ = 0x7fffffff;
      _kjCondition.left = ppRVar12;
      capnp::_::PointerReader::getStruct
                ((StructReader *)&checker,(PointerReader *)&existing,(word *)0x0);
      local_80 = (ArrayPtr<const_char>)
                 capnp::schema::Node::Reader::getDisplayName((Reader *)&checker);
      local_48 = (WirePointer *)(*ppRVar12)->encodedNode;
      local_58 = (ArrayPtr<const_char>)ZEXT816(0);
      local_40 = 0x7fffffff;
      capnp::_::PointerReader::getStruct(&existing._reader,(PointerReader *)&local_58,(word *)0x0);
      local_58 = (ArrayPtr<const_char>)
                 capnp::schema::Node::Reader::getDisplayName((Reader *)&existing._reader);
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::RawSchema_const*&,capnp::_::RawSchema_const*&>&,char_const(&)[53],unsigned_long_const&,capnp::Text::Reader,capnp::Text::Reader>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                 ,0x531,FAILED,"schema->canCastTo == nativeSchema",
                 "_kjCondition,\"two different compiled-in type have the same type ID\", nativeSchema->id, readMessageUnchecked<schema::Node>(nativeSchema->encodedNode).getDisplayName(), readMessageUnchecked<schema::Node>(schema->canCastTo->encodedNode).getDisplayName()"
                 ,&_kjCondition,
                 (char (*) [53])"two different compiled-in type have the same type ID",
                 &nativeSchema->id,(Reader *)&local_80,(Reader *)&local_58);
      kj::_::Debug::Fault::fatal(&f);
    }
    checker.nodeName.super_StringPtr.content.size_ = (size_t)schema->encodedNode;
    checker.loader = (Impl *)0x0;
    checker.nodeName.super_StringPtr.content.ptr = (char *)0x0;
    checker.existingNode._reader.segment._0_4_ = 0x7fffffff;
    capnp::_::PointerReader::getStruct(&existing._reader,(PointerReader *)&checker,(word *)0x0);
    checker.nodeName.super_StringPtr.content.size_ = (size_t)nativeSchema->encodedNode;
    checker.loader = (Impl *)0x0;
    checker.nodeName.super_StringPtr.content.ptr = (char *)0x0;
    checker.existingNode._reader.segment._0_4_ = 0x7fffffff;
    capnp::_::PointerReader::getStruct
              ((StructReader *)&_kjCondition,(PointerReader *)&checker,(word *)0x0);
    checker.nodeName.super_StringPtr.content.ptr = "";
    checker.nodeName.super_StringPtr.content.size_ = 1;
    checker.existingNode._reader.segment._0_4_ = 0;
    checker.existingNode._reader.segment._4_4_ = 0;
    checker.existingNode._reader.capTable._0_1_ = 0;
    checker.existingNode._reader.capTable._1_7_ = 0;
    checker.existingNode._reader.data._0_1_ = 0;
    checker.existingNode._reader.data._1_7_ = 0;
    checker.existingNode._reader.pointers._0_6_ = 0;
    checker.existingNode._reader.pointers._6_2_ = 0;
    checker.existingNode._reader.dataSize = 0;
    checker.existingNode._reader.pointerCount = 0;
    checker.existingNode._reader.nestingLimit = 0x7fffffff;
    checker.replacementNode._reader.segment = (SegmentReader *)0x0;
    checker.replacementNode._reader.capTable = (CapTableReader *)0x0;
    checker.replacementNode._reader.data = (void *)0x0;
    checker.replacementNode._reader.pointers._0_6_ = 0;
    checker.replacementNode._reader.pointers._6_2_ = 0;
    checker.replacementNode._reader.dataSize = 0;
    checker.replacementNode._reader.pointerCount = 0;
    checker.replacementNode._reader.nestingLimit = 0x7fffffff;
    checker.loader = this;
    bVar11 = CompatibilityChecker::shouldReplace(&checker,&existing,(Reader *)&_kjCondition,true);
    pIVar1 = schema->lazyInitializer;
    bVar15 = pIVar1 != (Initializer *)0x0;
    if (!bVar11) {
      *ppRVar12 = nativeSchema;
      if (nativeSchema->dependencyCount != 0) {
        uVar14 = 0;
        do {
          loadNative(this,nativeSchema->dependencies[uVar14]);
          uVar14 = uVar14 + 1;
        } while (uVar14 < nativeSchema->dependencyCount);
      }
      if (pIVar1 == (Initializer *)0x0) {
        return schema;
      }
      goto LAB_00373055;
    }
  }
  checker.loader = (Impl *)(nativeSchema->defaultBrand).generic;
  checker.nodeName.super_StringPtr.content.ptr = (char *)(nativeSchema->defaultBrand).scopes;
  checker.nodeName.super_StringPtr.content.size_ = (size_t)(nativeSchema->defaultBrand).dependencies
  ;
  uVar2._0_4_ = (nativeSchema->defaultBrand).scopeCount;
  uVar2._4_4_ = (nativeSchema->defaultBrand).dependencyCount;
  pIVar3 = (nativeSchema->defaultBrand).lazyInitializer;
  checker.existingNode._reader.capTable._0_1_ = SUB81(pIVar3,0);
  checker.existingNode._reader.capTable._1_7_ = (undefined7)((ulong)pIVar3 >> 8);
  checker.existingNode._reader.data._0_1_ =
       (undefined1)*(undefined8 *)&nativeSchema->mayContainCapabilities;
  checker.existingNode._reader.data._1_7_ =
       (undefined7)((ulong)*(undefined8 *)&nativeSchema->mayContainCapabilities >> 8);
  uVar4 = nativeSchema->id;
  pwVar5 = nativeSchema->encodedNode;
  uVar9 = nativeSchema->encodedSize;
  uVar10 = *(undefined4 *)&nativeSchema->field_0x14;
  ppRVar12 = nativeSchema->dependencies;
  puVar6 = nativeSchema->membersByName;
  uVar7 = nativeSchema->dependencyCount;
  uVar8 = nativeSchema->memberCount;
  pRVar13 = nativeSchema->canCastTo;
  schema->membersByDiscriminant = nativeSchema->membersByDiscriminant;
  schema->canCastTo = pRVar13;
  schema->membersByName = puVar6;
  schema->dependencyCount = uVar7;
  schema->memberCount = uVar8;
  schema->encodedSize = uVar9;
  *(undefined4 *)&schema->field_0x14 = uVar10;
  schema->dependencies = ppRVar12;
  schema->id = uVar4;
  schema->encodedNode = pwVar5;
  (schema->defaultBrand).generic = (RawSchema *)checker.loader;
  (schema->defaultBrand).scopes = (Scope *)checker.nodeName.super_StringPtr.content.ptr;
  (schema->defaultBrand).dependencies = (Dependency *)checker.nodeName.super_StringPtr.content.size_
  ;
  (schema->defaultBrand).scopeCount = (undefined4)uVar2;
  (schema->defaultBrand).dependencyCount = uVar2._4_4_;
  *(ulong *)((long)&(schema->defaultBrand).scopeCount + 1) =
       CONCAT17(checker.existingNode._reader.capTable._0_1_,(int7)((ulong)uVar2 >> 8));
  *(ulong *)((long)&(schema->defaultBrand).lazyInitializer + 1) =
       CONCAT17(checker.existingNode._reader.data._0_1_,checker.existingNode._reader.capTable._1_7_)
  ;
  (schema->defaultBrand).generic = schema;
  schema->canCastTo = nativeSchema;
  checker.existingNode._reader.segment._0_4_ = (undefined4)uVar2;
  checker.existingNode._reader.segment._4_4_ = uVar2._4_4_;
  ppRVar12 = (RawSchema **)
             kj::Arena::allocateBytes(&this->arena,(ulong)schema->dependencyCount << 3,8,false);
  if (nativeSchema->dependencyCount != 0) {
    uVar14 = 0;
    do {
      pRVar13 = loadNative(this,nativeSchema->dependencies[uVar14]);
      ppRVar12[uVar14] = pRVar13;
      uVar14 = uVar14 + 1;
    } while (uVar14 < nativeSchema->dependencyCount);
  }
  schema->dependencies = ppRVar12;
  local_70.ptr.field_1.value.ptr = (Scope *)0x0;
  local_70.ptr.field_1.value.size_ = 0;
  local_70.ptr.isSet = true;
  AVar16 = makeBrandedDependencies(this,schema,&local_70);
  (schema->defaultBrand).dependencies = AVar16.ptr;
  (schema->defaultBrand).dependencyCount = (uint32_t)AVar16.size_;
  kj::
  Table<kj::HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize>::Entry,kj::HashIndex<kj::HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize>::Callbacks>>
  ::find<0ul,unsigned_long_const&>
            ((Table<kj::HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize>::Entry,kj::HashIndex<kj::HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize>::Callbacks>>
              *)&existing,(unsigned_long *)&this->structSizeRequirements);
  if (existing._reader.segment != (SegmentReader *)0x0) {
    applyStructSizeRequirement
              (this,schema,(uint)(ushort)((existing._reader.segment)->id).value,
               (uint)*(ushort *)((long)&((existing._reader.segment)->id).value + 2));
  }
  if (!bVar15) {
    return schema;
  }
LAB_00373055:
  schema->lazyInitializer = (Initializer *)0x0;
  (schema->defaultBrand).lazyInitializer = (Initializer *)0x0;
  return schema;
}

Assistant:

_::RawSchema* SchemaLoader::Impl::loadNative(const _::RawSchema* nativeSchema) {
  _::RawSchema* schema;
  bool shouldReplace;
  bool shouldClearInitializer;
  KJ_IF_SOME(match, schemas.find(nativeSchema->id)) {
    schema = match;
    if (schema->canCastTo != nullptr) {
      // Already loaded natively, or we're currently in the process of loading natively and there
      // was a dependency cycle.
      KJ_REQUIRE(schema->canCastTo == nativeSchema,
          "two different compiled-in type have the same type ID",
          nativeSchema->id,
          readMessageUnchecked<schema::Node>(nativeSchema->encodedNode).getDisplayName(),
          readMessageUnchecked<schema::Node>(schema->canCastTo->encodedNode).getDisplayName());
      return schema;
    } else {
      auto existing = readMessageUnchecked<schema::Node>(schema->encodedNode);
      auto native = readMessageUnchecked<schema::Node>(nativeSchema->encodedNode);
      CompatibilityChecker checker(*this);
      shouldReplace = checker.shouldReplace(existing, native, true);
      shouldClearInitializer = schema->lazyInitializer != nullptr;
    }
  } else {
    schema = &arena.allocate<_::RawSchema>();
    memset(&schema->defaultBrand, 0, sizeof(schema->defaultBrand));
    schema->defaultBrand.generic = schema;
    schema->lazyInitializer = nullptr;
    schema->defaultBrand.lazyInitializer = nullptr;
    shouldReplace = true;
    shouldClearInitializer = false;  // already cleared above
    schemas.insert(nativeSchema->id, schema);
  }